

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uint64_t value,secp256k1_generator *value_gen,secp256k1_generator *blind_gen)

{
  int iVar1;
  long in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  int ret;
  int overflow;
  secp256k1_scalar sec;
  secp256k1_ge r;
  secp256k1_gej rj;
  secp256k1_ge blind_genp;
  secp256k1_ge value_genp;
  uint in_stack_fffffffffffffe1c;
  secp256k1_ge *in_stack_fffffffffffffe20;
  uchar *in_stack_fffffffffffffe28;
  secp256k1_scalar *in_stack_fffffffffffffe30;
  secp256k1_gej *in_stack_fffffffffffffe68;
  secp256k1_ge *in_stack_fffffffffffffe70;
  secp256k1_ge *in_stack_ffffffffffffff10;
  secp256k1_ge *in_stack_ffffffffffffff18;
  uint64_t in_stack_ffffffffffffff20;
  secp256k1_scalar *in_stack_ffffffffffffff28;
  secp256k1_gej *in_stack_ffffffffffffff30;
  int local_4;
  
  local_4 = 0;
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe20,
               (char *)((ulong)in_stack_fffffffffffffe1c << 0x20));
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe20,
               (char *)((ulong)in_stack_fffffffffffffe1c << 0x20));
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe20,
               (char *)((ulong)in_stack_fffffffffffffe1c << 0x20));
    local_4 = 0;
  }
  else if (in_R9 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)in_stack_fffffffffffffe20,
               (char *)((ulong)in_stack_fffffffffffffe1c << 0x20));
    local_4 = 0;
  }
  else {
    secp256k1_generator_load
              (in_stack_fffffffffffffe20,
               (secp256k1_generator *)((ulong)in_stack_fffffffffffffe1c << 0x20));
    secp256k1_generator_load
              (in_stack_fffffffffffffe20,
               (secp256k1_generator *)CONCAT44(in_stack_fffffffffffffe1c,local_4));
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,(int *)in_stack_fffffffffffffe20)
    ;
    if (in_stack_fffffffffffffe1c == 0) {
      secp256k1_pedersen_ecmult
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&stack0xfffffffffffffe98);
      if (iVar1 == 0) {
        secp256k1_ge_set_gej(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        secp256k1_pedersen_commitment_save
                  ((secp256k1_pedersen_commitment *)in_stack_fffffffffffffe20,
                   (secp256k1_ge *)CONCAT44(in_stack_fffffffffffffe1c,local_4));
        local_4 = 1;
      }
      secp256k1_gej_clear((secp256k1_gej *)0x10b682);
      secp256k1_ge_clear((secp256k1_ge *)0x10b68c);
    }
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffe20);
  }
  return local_4;
}

Assistant:

int secp256k1_pedersen_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, uint64_t value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen) {
    secp256k1_ge value_genp;
    secp256k1_ge blind_genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    int overflow;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    secp256k1_generator_load(&value_genp, value_gen);
    secp256k1_generator_load(&blind_genp, blind_gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    if (!overflow) {
        secp256k1_pedersen_ecmult(&rj, &sec, value, &value_genp, &blind_genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}